

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCodeGetColumn(Parse *pParse,Table *pTab,int iColumn,int iTable,int iReg,u8 p5)

{
  Vdbe *v_00;
  Vdbe *v;
  u8 p5_local;
  int iReg_local;
  int iTable_local;
  int iColumn_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  v_00 = pParse->pVdbe;
  sqlite3ExprCodeGetColumnOfTable(v_00,pTab,iTable,iColumn,iReg);
  if (p5 != '\0') {
    sqlite3VdbeChangeP5(v_00,(ushort)p5);
  }
  return iReg;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeGetColumn(
  Parse *pParse,   /* Parsing and code generating context */
  Table *pTab,     /* Description of the table we are reading from */
  int iColumn,     /* Index of the table column */
  int iTable,      /* The cursor pointing to the table */
  int iReg,        /* Store results here */
  u8 p5            /* P5 value for OP_Column + FLAGS */
){
  Vdbe *v = pParse->pVdbe;
  assert( v!=0 );
  sqlite3ExprCodeGetColumnOfTable(v, pTab, iTable, iColumn, iReg);
  if( p5 ){
    sqlite3VdbeChangeP5(v, p5);
  }
  return iReg;
}